

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::objectivec::HandleExtremeFloatingPoint
                   (string *__return_storage_ptr__,string *val,bool add_float_suffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  string *extraout_RAX;
  char *pcVar6;
  char *pcVar7;
  
  iVar4 = std::__cxx11::string::compare((char *)val);
  if (iVar4 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "NAN";
    pcVar6 = "";
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)val);
    if (iVar4 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "INFINITY";
      pcVar6 = "";
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)val);
      if (iVar4 != 0) {
        if (add_float_suffix) {
          lVar5 = std::__cxx11::string::find((char *)val,0x35b603,0);
          if (lVar5 == -1) {
            lVar5 = std::__cxx11::string::find((char *)val,0x3567f8,0);
            if (lVar5 == -1) {
              lVar5 = std::__cxx11::string::find((char *)val,0x3b0684,0);
              if (lVar5 == -1) goto LAB_002302e2;
            }
          }
          std::__cxx11::string::append((char *)val);
        }
LAB_002302e2:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (val->_M_dataplus)._M_p;
        paVar1 = &val->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar1) {
          uVar3 = *(undefined8 *)((long)&val->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = val->_M_string_length;
        (val->_M_dataplus)._M_p = (pointer)paVar1;
        val->_M_string_length = 0;
        (val->field_2)._M_local_buf[0] = '\0';
        return (string *)paVar1;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "-INFINITY";
      pcVar6 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return extraout_RAX;
}

Assistant:

static string HandleExtremeFloatingPoint(string val, bool add_float_suffix) {
  if (val == "nan") {
    return "NAN";
  } else if (val == "inf") {
    return "INFINITY";
  } else if (val == "-inf") {
    return "-INFINITY";
  } else {
    // float strings with ., e or E need to have f appended
    if (add_float_suffix &&
        (val.find(".") != string::npos || val.find("e") != string::npos ||
         val.find("E") != string::npos)) {
      val += "f";
    }
    return val;
  }
}